

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O0

vector<RPCArg,_std::allocator<RPCArg>_> * CreateTxDoc(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  initializer_list<RPCArg> __l_02;
  initializer_list<RPCArg> __l_03;
  initializer_list<RPCArg> __l_04;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffe368;
  allocator<RPCArg> *paVar1;
  RPCArg *this;
  UniValue *in_stack_ffffffffffffe370;
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  *in_stack_ffffffffffffe378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe380;
  allocator_type *in_stack_ffffffffffffe3a0;
  UniValue *in_stack_ffffffffffffe3a8;
  iterator in_stack_ffffffffffffe3b0;
  RPCArgOptions *in_stack_ffffffffffffe3b8;
  string *in_stack_ffffffffffffe3c0;
  Fallback *in_stack_ffffffffffffe3c8;
  undefined4 in_stack_ffffffffffffe3d0;
  Type in_stack_ffffffffffffe3d4;
  string *in_stack_ffffffffffffe3d8;
  undefined4 in_stack_ffffffffffffe3e0;
  Type in_stack_ffffffffffffe3e4;
  string *in_stack_ffffffffffffe3e8;
  RPCArg *in_stack_ffffffffffffe3f0;
  RPCArgOptions *in_stack_ffffffffffffe410;
  undefined1 *local_1b80;
  undefined1 *local_1b68;
  undefined1 *local_1b50;
  undefined1 *local_1b38;
  undefined1 *local_1b20;
  long *local_1b08;
  allocator<char> local_190c;
  undefined1 local_190b;
  allocator<char> local_190a;
  allocator<char> local_1909;
  undefined4 local_1908;
  allocator<char> local_1904 [3];
  allocator<char> local_1901;
  undefined4 local_1900;
  allocator<char> local_18f9 [32];
  allocator<char> local_18d9;
  undefined4 local_18d8;
  allocator<char> local_18d2 [2];
  undefined4 local_18d0;
  allocator<char> local_18c9 [32];
  allocator<char> local_18a9;
  undefined4 local_18a8;
  allocator<char> local_18a1 [28];
  allocator<char> local_1885;
  undefined4 local_1884;
  allocator<char> local_187f [3];
  allocator<char> local_187c;
  allocator<char> local_187b;
  allocator<char> local_187a;
  allocator<char> local_1879;
  undefined4 local_1878;
  allocator<char> local_1872;
  allocator<char> local_1871;
  undefined4 local_1870;
  allocator<char> local_1869 [32];
  allocator<char> local_1849;
  undefined4 local_1848;
  allocator<char> local_1841 [32];
  allocator<char> local_1821;
  undefined4 local_1820;
  allocator<char> local_1819;
  undefined1 local_1818;
  undefined8 local_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined1 local_17d8;
  undefined1 local_17d7;
  undefined1 local_16d8;
  undefined8 local_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined1 local_1698;
  undefined1 local_1697;
  undefined1 local_1598 [192];
  RPCArgOptions aRStack_14d8 [2];
  undefined1 local_1420 [264];
  undefined1 local_1318 [160];
  allocator<RPCArg> local_1278 [40];
  undefined8 local_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined1 local_1238;
  undefined1 local_1237;
  undefined1 local_1230;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 local_11f8;
  undefined1 local_11f0;
  undefined1 local_11ef;
  undefined1 local_1148 [264];
  undefined1 local_1040 [64];
  undefined8 local_1000;
  undefined1 local_fa0 [528];
  undefined1 local_d90 [160];
  allocator<RPCArg> local_cf0 [40];
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined1 local_cb0;
  undefined1 local_caf;
  allocator<RPCArg> local_ca8 [40];
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 local_c70;
  undefined1 local_c68;
  undefined1 local_c67;
  undefined1 local_c60;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined1 local_c20;
  undefined1 local_c1f;
  undefined1 local_b58;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined1 local_b18;
  undefined1 local_b17;
  undefined1 local_a70;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined1 local_a30;
  undefined1 local_a2f;
  undefined1 local_988 [792];
  undefined1 local_670 [160];
  undefined1 local_5d0 [264];
  undefined1 local_4c8 [160];
  long local_428 [132];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3b8,(char *)in_stack_ffffffffffffe3b0,
             (allocator<char> *)in_stack_ffffffffffffe3a8);
  local_1820 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            (in_stack_ffffffffffffe378,&in_stack_ffffffffffffe370->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3b8,(char *)in_stack_ffffffffffffe3b0,
             (allocator<char> *)in_stack_ffffffffffffe3a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3b8,(char *)in_stack_ffffffffffffe3b0,
             (allocator<char> *)in_stack_ffffffffffffe3a8);
  local_1848 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            (in_stack_ffffffffffffe378,&in_stack_ffffffffffffe370->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3b8,(char *)in_stack_ffffffffffffe3b0,
             (allocator<char> *)in_stack_ffffffffffffe3a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3b8,(char *)in_stack_ffffffffffffe3b0,
             (allocator<char> *)in_stack_ffffffffffffe3a8);
  local_1870 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            (in_stack_ffffffffffffe378,&in_stack_ffffffffffffe370->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3b8,(char *)in_stack_ffffffffffffe3b0,
             (allocator<char> *)in_stack_ffffffffffffe3a8);
  local_a70 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe380);
  local_a48 = 0;
  uStack_a40 = 0;
  local_a38 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe368);
  local_a30 = 0;
  local_a2f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe3e4,in_stack_ffffffffffffe3e0),
                 in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d4,in_stack_ffffffffffffe3c8,
                 in_stack_ffffffffffffe3c0,in_stack_ffffffffffffe3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3b8,(char *)in_stack_ffffffffffffe3b0,
             (allocator<char> *)in_stack_ffffffffffffe3a8);
  local_1878 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            (in_stack_ffffffffffffe378,&in_stack_ffffffffffffe370->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3b8,(char *)in_stack_ffffffffffffe3b0,
             (allocator<char> *)in_stack_ffffffffffffe3a8);
  local_b58 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe380);
  local_b30 = 0;
  uStack_b28 = 0;
  local_b20 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe368);
  local_b18 = 0;
  local_b17 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe3e4,in_stack_ffffffffffffe3e0),
                 in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d4,in_stack_ffffffffffffe3c8,
                 in_stack_ffffffffffffe3c0,in_stack_ffffffffffffe3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3b8,(char *)in_stack_ffffffffffffe3b0,
             (allocator<char> *)in_stack_ffffffffffffe3a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3b8,(char *)in_stack_ffffffffffffe3b0,
             (allocator<char> *)in_stack_ffffffffffffe3a8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            (in_stack_ffffffffffffe378,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe370);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3b8,(char *)in_stack_ffffffffffffe3b0,
             (allocator<char> *)in_stack_ffffffffffffe3a8);
  local_c60 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe380);
  local_c38 = 0;
  uStack_c30 = 0;
  local_c28 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe368);
  local_c20 = 0;
  local_c1f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe3e4,in_stack_ffffffffffffe3e0),
                 in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d4,in_stack_ffffffffffffe3c8,
                 in_stack_ffffffffffffe3c0,in_stack_ffffffffffffe3b8);
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffe368);
  __l._M_len = (size_type)in_stack_ffffffffffffe3b8;
  __l._M_array = in_stack_ffffffffffffe3b0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe3a8,__l,
             in_stack_ffffffffffffe3a0);
  local_ca8[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_ffffffffffffe380);
  local_c80 = 0;
  uStack_c78 = 0;
  local_c70 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe368);
  local_c68 = 0;
  local_c67 = 0;
  paVar1 = local_ca8;
  RPCArg::RPCArg(in_stack_ffffffffffffe3f0,in_stack_ffffffffffffe3e8,in_stack_ffffffffffffe3e4,
                 (Fallback *)in_stack_ffffffffffffe3d8,
                 (string *)CONCAT44(in_stack_ffffffffffffe3d4,in_stack_ffffffffffffe3d0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe3c8,
                 in_stack_ffffffffffffe410);
  std::allocator<RPCArg>::allocator(paVar1);
  __l_00._M_len = (size_type)in_stack_ffffffffffffe3b8;
  __l_00._M_array = in_stack_ffffffffffffe3b0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe3a8,__l_00,
             in_stack_ffffffffffffe3a0);
  local_cf0[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_ffffffffffffe380);
  local_cc8 = 0;
  uStack_cc0 = 0;
  local_cb8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar1);
  local_cb0 = 0;
  local_caf = 0;
  paVar1 = local_cf0;
  RPCArg::RPCArg(in_stack_ffffffffffffe3f0,in_stack_ffffffffffffe3e8,in_stack_ffffffffffffe3e4,
                 (Fallback *)in_stack_ffffffffffffe3d8,
                 (string *)CONCAT44(in_stack_ffffffffffffe3d4,in_stack_ffffffffffffe3d0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe3c8,
                 in_stack_ffffffffffffe410);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3b8,(char *)in_stack_ffffffffffffe3b0,
             (allocator<char> *)in_stack_ffffffffffffe3a8);
  local_1884 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            (in_stack_ffffffffffffe378,&in_stack_ffffffffffffe370->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3b8,(char *)in_stack_ffffffffffffe3b0,
             (allocator<char> *)in_stack_ffffffffffffe3a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3b8,(char *)in_stack_ffffffffffffe3b0,
             (allocator<char> *)in_stack_ffffffffffffe3a8);
  local_18a8 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            (in_stack_ffffffffffffe378,&in_stack_ffffffffffffe370->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3b8,(char *)in_stack_ffffffffffffe3b0,
             (allocator<char> *)in_stack_ffffffffffffe3a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3b8,(char *)in_stack_ffffffffffffe3b0,
             (allocator<char> *)in_stack_ffffffffffffe3a8);
  local_18d0 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            (in_stack_ffffffffffffe378,&in_stack_ffffffffffffe370->typ);
  std::operator+(&in_stack_ffffffffffffe3b8->skip_type_check,&in_stack_ffffffffffffe3b0->m_names);
  local_1230 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe380);
  local_1208 = 0;
  uStack_1200 = 0;
  local_11f8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar1);
  local_11f0 = 0;
  local_11ef = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe3e4,in_stack_ffffffffffffe3e0),
                 in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d4,in_stack_ffffffffffffe3c8,
                 in_stack_ffffffffffffe3c0,in_stack_ffffffffffffe3b8);
  std::allocator<RPCArg>::allocator(paVar1);
  __l_01._M_len = (size_type)in_stack_ffffffffffffe3b8;
  __l_01._M_array = in_stack_ffffffffffffe3b0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe3a8,__l_01,
             in_stack_ffffffffffffe3a0);
  local_1278[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_ffffffffffffe380);
  local_1250 = 0;
  uStack_1248 = 0;
  local_1240 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar1);
  local_1238 = 0;
  local_1237 = 0;
  paVar1 = local_1278;
  RPCArg::RPCArg(in_stack_ffffffffffffe3f0,in_stack_ffffffffffffe3e8,in_stack_ffffffffffffe3e4,
                 (Fallback *)in_stack_ffffffffffffe3d8,
                 (string *)CONCAT44(in_stack_ffffffffffffe3d4,in_stack_ffffffffffffe3d0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe3c8,
                 in_stack_ffffffffffffe410);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3b8,(char *)in_stack_ffffffffffffe3b0,
             (allocator<char> *)in_stack_ffffffffffffe3a8);
  local_18d8 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            (in_stack_ffffffffffffe378,&in_stack_ffffffffffffe370->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3b8,(char *)in_stack_ffffffffffffe3b0,
             (allocator<char> *)in_stack_ffffffffffffe3a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3b8,(char *)in_stack_ffffffffffffe3b0,
             (allocator<char> *)in_stack_ffffffffffffe3a8);
  local_1900 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            (in_stack_ffffffffffffe378,&in_stack_ffffffffffffe370->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3b8,(char *)in_stack_ffffffffffffe3b0,
             (allocator<char> *)in_stack_ffffffffffffe3a8);
  local_1598[0x90] = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe380);
  local_1598._184_8_ = 0;
  aRStack_14d8[0].skip_type_check = false;
  aRStack_14d8[0]._1_7_ = 0;
  aRStack_14d8[0].oneline_description._M_dataplus._M_p = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar1);
  aRStack_14d8[0].oneline_description._M_string_length._0_1_ = 0;
  aRStack_14d8[0].oneline_description._M_string_length._1_1_ = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe3e4,in_stack_ffffffffffffe3e0),
                 in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d4,in_stack_ffffffffffffe3c8,
                 in_stack_ffffffffffffe3c0,in_stack_ffffffffffffe3b8);
  std::allocator<RPCArg>::allocator(paVar1);
  __l_02._M_len = (size_type)in_stack_ffffffffffffe3b8;
  __l_02._M_array = in_stack_ffffffffffffe3b0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe3a8,__l_02,
             in_stack_ffffffffffffe3a0);
  local_1598[0x48] = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe380);
  local_1598._112_8_ = 0;
  local_1598._120_8_ = 0;
  local_1598._128_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar1);
  local_1598[0x88] = 0;
  local_1598[0x89] = 0;
  paVar1 = (allocator<RPCArg> *)(local_1598 + 0x48);
  RPCArg::RPCArg(in_stack_ffffffffffffe3f0,in_stack_ffffffffffffe3e8,in_stack_ffffffffffffe3e4,
                 (Fallback *)in_stack_ffffffffffffe3d8,
                 (string *)CONCAT44(in_stack_ffffffffffffe3d4,in_stack_ffffffffffffe3d0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe3c8,
                 in_stack_ffffffffffffe410);
  std::allocator<RPCArg>::allocator(paVar1);
  __l_03._M_len = (size_type)in_stack_ffffffffffffe3b8;
  __l_03._M_array = in_stack_ffffffffffffe3b0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe3a8,__l_03,
             in_stack_ffffffffffffe3a0);
  local_1598[0] = 1;
  std::__cxx11::string::string(in_stack_ffffffffffffe380);
  local_1598._40_8_ = (pointer)0x0;
  local_1598._48_8_ = (pointer)0x0;
  local_1598._56_8_ = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar1);
  local_1598[0x40] = 0;
  local_1598[0x41] = 0;
  this = (RPCArg *)local_1598;
  RPCArg::RPCArg(in_stack_ffffffffffffe3f0,in_stack_ffffffffffffe3e8,in_stack_ffffffffffffe3e4,
                 (Fallback *)in_stack_ffffffffffffe3d8,
                 (string *)CONCAT44(in_stack_ffffffffffffe3d4,in_stack_ffffffffffffe3d0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe3c8,
                 in_stack_ffffffffffffe410);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3b8,(char *)in_stack_ffffffffffffe3b0,
             (allocator<char> *)in_stack_ffffffffffffe3a8);
  local_1908 = 0;
  UniValue::UniValue<int,_int,_true>(in_stack_ffffffffffffe3a8,(int *)in_stack_ffffffffffffe3a0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>(in_stack_ffffffffffffe378,in_stack_ffffffffffffe370);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3b8,(char *)in_stack_ffffffffffffe3b0,
             (allocator<char> *)in_stack_ffffffffffffe3a8);
  local_16d8 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe380);
  local_16b0 = 0;
  uStack_16a8 = 0;
  local_16a0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this);
  local_1698 = 0;
  local_1697 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe3e4,in_stack_ffffffffffffe3e0),
                 in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d4,in_stack_ffffffffffffe3c8,
                 in_stack_ffffffffffffe3c0,in_stack_ffffffffffffe3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3b8,(char *)in_stack_ffffffffffffe3b0,
             (allocator<char> *)in_stack_ffffffffffffe3a8);
  local_190b = 1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffe3a8,(bool *)in_stack_ffffffffffffe3a0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>(in_stack_ffffffffffffe378,in_stack_ffffffffffffe370);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe3b8,(char *)in_stack_ffffffffffffe3b0,
             (allocator<char> *)in_stack_ffffffffffffe3a8);
  local_1818 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe380);
  local_17f0 = 0;
  uStack_17e8 = 0;
  local_17e0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this);
  local_17d8 = 0;
  local_17d7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe3e4,in_stack_ffffffffffffe3e0),
                 in_stack_ffffffffffffe3d8,in_stack_ffffffffffffe3d4,in_stack_ffffffffffffe3c8,
                 in_stack_ffffffffffffe3c0,in_stack_ffffffffffffe3b8);
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)this);
  __l_04._M_len = (size_type)in_stack_ffffffffffffe3b8;
  __l_04._M_array = in_stack_ffffffffffffe3b0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe3a8,__l_04,
             in_stack_ffffffffffffe3a0);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_1b08 = &local_8;
  do {
    local_1b08 = local_1b08 + -0x21;
    RPCArg::~RPCArg(this);
  } while (local_1b08 != local_428);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_190c);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_190a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1909);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1904);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe378);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_1b20 = local_d90;
  do {
    local_1b20 = local_1b20 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_1b20 != local_fa0);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe378);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_1b38 = local_1318;
  do {
    local_1b38 = local_1b38 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_1b38 != local_1420);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1901);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_18f9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_18d9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_18d2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe378);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_1b50 = local_1040;
  do {
    local_1b50 = local_1b50 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_1b50 != local_1148);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_18c9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_18a9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_18a1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1885);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_187f);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe378);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_1b68 = local_4c8;
  do {
    local_1b68 = local_1b68 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_1b68 != local_5d0);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe378);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_1b80 = local_670;
  do {
    local_1b80 = local_1b80 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_1b80 != local_988);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_187c);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_187b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_187a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1879);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1872);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1871);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1869);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1849);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1841);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1821);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1819);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<RPCArg> CreateTxDoc()
{
    return {
        {"inputs", RPCArg::Type::ARR, RPCArg::Optional::NO, "The inputs",
            {
                {"", RPCArg::Type::OBJ, RPCArg::Optional::OMITTED, "",
                    {
                        {"txid", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The transaction id"},
                        {"vout", RPCArg::Type::NUM, RPCArg::Optional::NO, "The output number"},
                        {"sequence", RPCArg::Type::NUM, RPCArg::DefaultHint{"depends on the value of the 'replaceable' and 'locktime' arguments"}, "The sequence number"},
                    },
                },
            },
        },
        {"outputs", RPCArg::Type::ARR, RPCArg::Optional::NO, "The outputs specified as key-value pairs.\n"
                "Each key may only appear once, i.e. there can only be one 'data' output, and no address may be duplicated.\n"
                "At least one output of either type must be specified.\n"
                "For compatibility reasons, a dictionary, which holds the key-value pairs directly, is also\n"
                "                             accepted as second parameter.",
            {
                {"", RPCArg::Type::OBJ_USER_KEYS, RPCArg::Optional::OMITTED, "",
                    {
                        {"address", RPCArg::Type::AMOUNT, RPCArg::Optional::NO, "A key-value pair. The key (string) is the bitcoin address, the value (float or string) is the amount in " + CURRENCY_UNIT},
                    },
                },
                {"", RPCArg::Type::OBJ, RPCArg::Optional::OMITTED, "",
                    {
                        {"data", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "A key-value pair. The key must be \"data\", the value is hex-encoded data"},
                    },
                },
            },
         RPCArgOptions{.skip_type_check = true}},
        {"locktime", RPCArg::Type::NUM, RPCArg::Default{0}, "Raw locktime. Non-0 value also locktime-activates inputs"},
        {"replaceable", RPCArg::Type::BOOL, RPCArg::Default{true}, "Marks this transaction as BIP125-replaceable.\n"
                "Allows this transaction to be replaced by a transaction with higher fees. If provided, it is an error if explicit sequence numbers are incompatible."},
    };
}